

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

bool __thiscall QTreeViewPrivate::hasVisibleChildren(QTreeViewPrivate *this,QModelIndex *parent)

{
  QTreeView *this_00;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  char cVar3;
  bool bVar4;
  ItemFlags IVar5;
  int iVar6;
  int row;
  int iVar7;
  
  this_00 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  IVar5 = QModelIndex::flags(parent);
  if (-1 < (char)IVar5.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.
                 i) {
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    cVar3 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,parent);
    if (cVar3 != '\0') {
      pDVar2 = (this->hiddenIndexes).q_hash.d;
      if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
        cVar3 = (**(code **)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x2c0))(this_00,parent);
        row = 0;
        if (cVar3 != '\0') goto LAB_0053f66b;
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        iVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
        iVar7 = 0;
        if (0 < iVar6) {
          row = 0;
          iVar7 = iVar6;
        }
        do {
          if (iVar7 == row) {
            row = 1;
            if (iVar6 != 0) goto LAB_0053f669;
            goto LAB_0053f66b;
          }
          bVar4 = QTreeView::isRowHidden(this_00,row,parent);
          row = row + 1;
        } while (bVar4);
      }
      row = 1;
      goto LAB_0053f66b;
    }
  }
LAB_0053f669:
  row = 0;
LAB_0053f66b:
  return SUB41(row,0);
}

Assistant:

bool QTreeViewPrivate::hasVisibleChildren(const QModelIndex& parent) const
{
    Q_Q(const QTreeView);
    if (parent.flags() & Qt::ItemNeverHasChildren)
        return false;
    if (model->hasChildren(parent)) {
        if (hiddenIndexes.isEmpty())
            return true;
        if (q->isIndexHidden(parent))
            return false;
        int rowCount = model->rowCount(parent);
        for (int i = 0; i < rowCount; ++i) {
            if (!q->isRowHidden(i, parent))
                return true;
        }
        if (rowCount == 0)
            return true;
    }
    return false;
}